

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void start_children(char *prefix,int argc,char **argv)

{
  pid_t __pid;
  pid_t __pid_00;
  char *__ptr;
  char client_name [100];
  char server_name [100];
  char *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  char local_108 [112];
  char local_98 [104];
  
  __ptr = find_build_path();
  sprintf(local_98,"%s/%s/%s-%s",__ptr,prefix,prefix,"server");
  sprintf(local_108,"%s/%s/%s-%s",__ptr,prefix,prefix,"client");
  uStack_140 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = local_98;
  copy_arguments(&local_148,argc,argv);
  __pid = start_process(&local_148);
  uStack_140 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = local_108;
  copy_arguments(&local_148,argc,argv);
  __pid_00 = start_process(&local_148);
  waitpid(__pid,(int *)0x0,2);
  waitpid(__pid_00,(int *)0x0,2);
  free(__ptr);
  return;
}

Assistant:

void start_children(char *prefix, int argc, char *argv[]) {
	char server_name[100];
	char client_name[100];

	char *build_path = find_build_path();

	// clang-format off
	sprintf(
		server_name,
		"%s/%s/%s-%s",
		build_path,
		prefix,
		prefix,
		"server"
	);

	sprintf(
		client_name,
		"%s/%s/%s-%s",
		build_path,
		prefix,
		prefix,
		"client"
	);
	// clang-format on

	pid_t c1_id = start_child(server_name, argc, argv);
	pid_t c2_id = start_child(client_name, argc, argv);

	waitpid(c1_id, NULL, WUNTRACED);
	waitpid(c2_id, NULL, WUNTRACED);

	free(build_path);
}